

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_chunk_check_crc(uchar *chunk)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar3 = *(uint *)chunk;
  uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  uVar1 = (ulong)(uVar3 + 8);
  uVar3 = uVar3 + 4;
  if (uVar3 == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0xffffffff;
    uVar4 = 0;
    do {
      uVar2 = uVar2 >> 8 ^ lodepng_crc32_table[(byte)(chunk[uVar4 + 4] ^ (byte)uVar2)];
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
    uVar2 = ~uVar2;
  }
  return (uint)(((uint)chunk[uVar1 + 2] << 8 |
                 (uint)chunk[uVar1] << 0x18 | (uint)chunk[uVar1 + 1] << 0x10 |
                (uint)chunk[uVar1 + 3]) != uVar2);
}

Assistant:

static unsigned lodepng_read32bitInt(const unsigned char* buffer) {
  return (((unsigned)buffer[0] << 24u) | ((unsigned)buffer[1] << 16u) |
    ((unsigned)buffer[2] << 8u) | (unsigned)buffer[3]);
}